

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this)

{
  ~SimpleTypeData(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}